

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

void __thiscall ON_XMLVariant::SetValue(ON_XMLVariant *this,ON_4fColor *c)

{
  ON_XMLVariantPrivate *pOVar1;
  float fVar2;
  
  (*this->_vptr_ON_XMLVariant[0xd])();
  this->_private->_type = DoubleColor4;
  fVar2 = ON_4fColor::Red(c);
  (this->_private->field_2)._double_val = (double)fVar2;
  fVar2 = ON_4fColor::Green(c);
  (this->_private->field_2).m_xform.m_xform[0][1] = (double)fVar2;
  fVar2 = ON_4fColor::Blue(c);
  (this->_private->field_2).m_xform.m_xform[0][2] = (double)fVar2;
  fVar2 = ON_4fColor::Alpha(c);
  (this->_private->field_2).m_xform.m_xform[0][3] = (double)fVar2;
  pOVar1 = this->_private;
  pOVar1->_type_pending = false;
  pOVar1->_varies = false;
  return;
}

Assistant:

void ON_XMLVariant::SetValue(const ON_4fColor& c)
{
  ClearBuffers();

  _private->_type = Types::DoubleColor4;

  _private->_array_val[0] = c.Red();
  _private->_array_val[1] = c.Green();
  _private->_array_val[2] = c.Blue();
  _private->_array_val[3] = c.Alpha();

  _private->_varies = false;
  _private->_type_pending = false;
}